

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

void duckdb::BitStringAggOperation::
     Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
               (BitAggState<duckdb::hugeint_t> *state,hugeint_t *input,
               AggregateUnaryInput *unary_input)

{
  char cVar1;
  FunctionData *pFVar2;
  idx_t iVar3;
  ulong uVar4;
  void *__src;
  OutOfRangeException *pOVar5;
  BinderException *this;
  InvalidInputException *this_00;
  hugeint_t hVar6;
  hugeint_t hVar7;
  hugeint_t hVar8;
  hugeint_t hVar9;
  hugeint_t hVar10;
  hugeint_t hVar11;
  hugeint_t hVar12;
  allocator local_131;
  anon_union_16_2_67f50693_for_value local_130 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&unary_input->input->bind_data);
  if (state->is_set == false) {
    if ((pFVar2[0x20] != (FunctionData)0x0) || (pFVar2[0x60] == (FunctionData)0x1)) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_130[0].pointer,
                 "Could not retrieve required statistics. Alternatively, try by providing the statistics explicitly: BITSTRING_AGG(col, min, max) "
                 ,&local_131);
      duckdb::BinderException::BinderException(this,(string *)&local_130[0].pointer);
      __cxa_throw(this,&BinderException::typeinfo,std::runtime_error::~runtime_error);
    }
    hVar6 = duckdb::Value::GetValue<duckdb::hugeint_t>();
    state->min = hVar6;
    hVar6 = duckdb::Value::GetValue<duckdb::hugeint_t>();
    state->max = hVar6;
    cVar1 = duckdb::hugeint_t::operator>(&state->min,&state->max);
    if (cVar1 != '\0') {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_130[0].pointer,
                 "Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",&local_131);
      hVar6.upper = (state->min).lower;
      hVar6.lower = (uint64_t)&local_50;
      duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar6);
      hVar7.upper = (state->max).lower;
      hVar7.lower = (uint64_t)&local_70;
      duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar7);
      InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                (this_00,(string *)&local_130[0].pointer,&local_50,&local_70);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    hVar6 = duckdb::Value::GetValue<duckdb::hugeint_t>();
    hVar7 = duckdb::Value::GetValue<duckdb::hugeint_t>();
    iVar3 = GetRange<duckdb::hugeint_t>(hVar6,hVar7);
    if (1000000000 < iVar3) {
      pOVar5 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_130[0].pointer,
                 "The range between min and max value (%s <-> %s) is too large for bitstring aggregation"
                 ,&local_131);
      hVar11.upper = (state->min).lower;
      hVar11.lower = (uint64_t)&local_90;
      duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar11);
      hVar12.upper = (state->max).lower;
      hVar12.lower = (uint64_t)&local_b0;
      duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar12);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                (pOVar5,(string *)&local_130[0].pointer,&local_90,&local_b0);
      __cxa_throw(pOVar5,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar4 = duckdb::Bit::ComputeBitstringLen(iVar3);
    local_130[0]._0_4_ = (undefined4)uVar4;
    if (0xc < uVar4) {
      __src = operator_new__(uVar4);
      if ((uint)local_130[0]._0_4_ < 0xd) {
        local_130[0]._12_4_ = 0;
        local_130[0]._4_1_ = '\0';
        local_130[0]._5_1_ = '\0';
        local_130[0]._6_1_ = '\0';
        local_130[0]._7_1_ = '\0';
        local_130[0]._8_4_ = 0;
        if (local_130[0]._0_4_ != 0) {
          memcpy(local_130[0].pointer.prefix,__src,(ulong)(local_130[0]._0_4_ & 0xf));
        }
      }
      else {
        local_130[0]._8_4_ = SUB84(__src,0);
        local_130[0]._12_4_ = (undefined4)((ulong)__src >> 0x20);
      }
    }
    duckdb::Bit::SetEmptyBitString((string_t *)&local_130[0].pointer,iVar3);
    *(ulong *)&(state->value).value =
         CONCAT44(local_130[0].pointer.prefix,local_130[0].pointer.length);
    (state->value).value.pointer.ptr = (char *)CONCAT44(local_130[0]._12_4_,local_130[0]._8_4_);
    state->is_set = true;
  }
  cVar1 = duckdb::hugeint_t::operator>=(input,&state->min);
  if ((cVar1 != '\0') && (cVar1 = duckdb::hugeint_t::operator<=(input,&state->max), cVar1 != '\0'))
  {
    hVar6 = *input;
    hVar7 = duckdb::Value::GetValue<duckdb::hugeint_t>();
    Execute<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>>(state,hVar6,hVar7);
    return;
  }
  pOVar5 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_130[0].pointer,
             "Value %s is outside of provided min and max range (%s <-> %s)",&local_131);
  hVar8.upper = input->lower;
  hVar8.lower = (uint64_t)&local_d0;
  duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar8);
  hVar9.upper = (state->min).lower;
  hVar9.lower = (uint64_t)&local_f0;
  duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar9);
  hVar10.upper = (state->max).lower;
  hVar10.lower = (uint64_t)&local_110;
  duckdb::NumericHelper::ToString<duckdb::hugeint_t>(hVar10);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pOVar5,(string *)&local_130[0].pointer,&local_d0,&local_f0,&local_110);
  __cxa_throw(pOVar5,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_agg_data = unary_input.input.bind_data->template Cast<BitstringAggBindData>();
		if (!state.is_set) {
			if (bind_agg_data.min.IsNull() || bind_agg_data.max.IsNull()) {
				throw BinderException(
				    "Could not retrieve required statistics. Alternatively, try by providing the statistics "
				    "explicitly: BITSTRING_AGG(col, min, max) ");
			}
			state.min = bind_agg_data.min.GetValue<INPUT_TYPE>();
			state.max = bind_agg_data.max.GetValue<INPUT_TYPE>();
			if (state.min > state.max) {
				throw InvalidInputException("Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",
				                            NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t bit_range =
			    GetRange(bind_agg_data.min.GetValue<INPUT_TYPE>(), bind_agg_data.max.GetValue<INPUT_TYPE>());
			if (bit_range > MAX_BIT_RANGE) {
				throw OutOfRangeException(
				    "The range between min and max value (%s <-> %s) is too large for bitstring aggregation",
				    NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t len = Bit::ComputeBitstringLen(bit_range);
			auto target = len > string_t::INLINE_LENGTH ? string_t(new char[len], UnsafeNumericCast<uint32_t>(len))
			                                            : string_t(UnsafeNumericCast<uint32_t>(len));
			Bit::SetEmptyBitString(target, bit_range);

			state.value = target;
			state.is_set = true;
		}
		if (input >= state.min && input <= state.max) {
			Execute(state, input, bind_agg_data.min.GetValue<INPUT_TYPE>());
		} else {
			throw OutOfRangeException("Value %s is outside of provided min and max range (%s <-> %s)",
			                          NumericHelper::ToString(input), NumericHelper::ToString(state.min),
			                          NumericHelper::ToString(state.max));
		}
	}